

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O3

void PDHG_Compute_Dual_Feasibility
               (CUPDLPwork *work,cupdlp_float *dualResidual,cupdlp_float *aty,cupdlp_float *x,
               cupdlp_float *y,cupdlp_float *dDualFeasibility,cupdlp_float *dDualObj,
               cupdlp_float *dComplementarity,cupdlp_float *dSlackPos,cupdlp_float *dSlackNeg)

{
  double dVar1;
  CUPDLPproblem *pCVar2;
  CUPDLPresobj *pCVar3;
  CUPDLPdata *pCVar4;
  CUPDLPscaling *pCVar5;
  cupdlp_int index;
  cupdlp_float local_48;
  cupdlp_float local_40;
  int local_34;
  
  pCVar2 = work->problem;
  pCVar3 = work->resobj;
  pCVar4 = pCVar2->data;
  pCVar5 = work->scaling;
  cupdlp_dot(work,pCVar4->nRows,y,pCVar2->rhs,dDualObj);
  memcpy(dualResidual,aty,(long)pCVar4->nCols << 3);
  cupdlp_scaleVector(work,-1.0,dualResidual,pCVar4->nCols);
  local_40 = 1.0;
  cupdlp_axpy(work,pCVar4->nCols,&local_40,pCVar2->cost,dualResidual);
  memcpy(dSlackPos,dualResidual,(long)pCVar4->nCols << 3);
  cupdlp_projPos(dSlackPos,pCVar4->nCols);
  cupdlp_edot(dSlackPos,pCVar2->hasLower,pCVar4->nCols);
  local_48 = 0.0;
  cupdlp_dot(work,pCVar4->nCols,dSlackPos,pCVar3->dLowerFiltered,&local_48);
  *dDualObj = local_48 + *dDualObj;
  memcpy(dSlackNeg,dualResidual,(long)pCVar4->nCols << 3);
  cupdlp_projNeg(dSlackNeg,pCVar4->nCols);
  cupdlp_scaleVector(work,-1.0,dSlackNeg,pCVar4->nCols);
  cupdlp_edot(dSlackNeg,pCVar2->hasUpper,pCVar4->nCols);
  cupdlp_dot(work,pCVar4->nCols,dSlackNeg,pCVar3->dUpperFiltered,&local_48);
  dVar1 = *dDualObj;
  *dDualObj = dVar1 - local_48;
  *dDualObj = (dVar1 - local_48) * pCVar2->sense_origin + pCVar2->offset;
  local_40 = -1.0;
  cupdlp_axpy(work,pCVar4->nCols,&local_40,dSlackPos,dualResidual);
  local_40 = 1.0;
  cupdlp_axpy(work,pCVar4->nCols,&local_40,dSlackNeg,dualResidual);
  if (pCVar5->ifScaled != 0) {
    cupdlp_edot(dualResidual,work->colScale,pCVar4->nCols);
  }
  if (work->settings->iInfNormAbsLocalTermination == 0) {
    cupdlp_twoNorm(work,pCVar4->nCols,dualResidual,dDualFeasibility);
  }
  else {
    cupdlp_infNormIndex(work,pCVar4->nCols,dualResidual,&local_34);
    *dDualFeasibility = ABS(dualResidual[local_34]);
  }
  return;
}

Assistant:

void PDHG_Compute_Dual_Feasibility(CUPDLPwork *work, cupdlp_float *dualResidual,
                                   const cupdlp_float *aty, const cupdlp_float *x,
                                   const cupdlp_float *y, cupdlp_float *dDualFeasibility,
                                   cupdlp_float *dDualObj, cupdlp_float *dComplementarity,
                                   cupdlp_float *dSlackPos, cupdlp_float *dSlackNeg) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPscaling *scaling = work->scaling;
  // todo, compute Neumaier
  //    *dDualObj = Dotprod_Neumaier(problem->rhs, y, lp->nRows);
  cupdlp_dot(work, lp->nRows, y, problem->rhs, dDualObj);

  #if !defined(CUPDLP_CPU) && USE_KERNELS
  dualResidual = work->buffer2;

  cupdlp_float alpha;
  cupdlp_dual_feasibility_kernel_1_cuda(dualResidual, aty,
                                        problem->cost, lp->nCols);

  cupdlp_dual_feasibility_kernel_2_cuda(dSlackPos, dualResidual,
                                        problem->hasLower, lp->nCols);

  cupdlp_float temp = 0.0;
  cupdlp_dot(work, lp->nCols, dSlackPos, resobj->dLowerFiltered, &temp);
  *dDualObj += temp;

  cupdlp_dual_feasibility_kernel_3_cuda(dSlackNeg, dualResidual,
                                        problem->hasUpper, lp->nCols);

  cupdlp_dot(work, lp->nCols, dSlackNeg, resobj->dUpperFiltered, &temp);
  *dDualObj -= temp;

  *dDualObj = *dDualObj * problem->sense_origin + problem->offset;

  alpha = -1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackPos, dualResidual);
  alpha = 1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackNeg, dualResidual);

  if (scaling->ifScaled) {
    cupdlp_edot(dualResidual, work->colScale, lp->nCols);
  }
  cupdlp_twoNorm(work, lp->nCols, dualResidual, dDualFeasibility);

#else
  // *dComplementarity = 0.0;

  // @note:
  // original dual residual in pdlp:
  // they compute:
  //    violation   +  reduced cost
  //  |max(-y, 0)|  + |(I-\Pi)(c-Α'\nu)|
  // compute c - A'y

  CUPDLP_COPY_VEC(dualResidual, aty, cupdlp_float, lp->nCols);
  cupdlp_float alpha = -1.0;
  cupdlp_scaleVector(work, alpha, dualResidual, lp->nCols);

  alpha = 1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, problem->cost, dualResidual);

  //    julia version
  //        function compute_reduced_costs_from_primal_gradient_kernel!(
  //            primal_gradient::CuDeviceVector{Float64},
  //            isfinite_variable_lower_bound::CuDeviceVector{Bool},
  //            isfinite_variable_upper_bound::CuDeviceVector{Bool},
  //            num_variables::Int64,
  //            reduced_costs::CuDeviceVector{Float64},
  //            reduced_costs_violation::CuDeviceVector{Float64},
  //        )
  //            tx = threadIdx().x + (blockDim().x * (blockIdx().x - 0x1))
  //            if tx <= num_variables
  //                @inbounds begin
  //                    reduced_costs[tx] = max(primal_gradient[tx], 0.0) *
  //                    isfinite_variable_lower_bound[tx] +
  //                    min(primal_gradient[tx], 0.0) *
  //                    isfinite_variable_upper_bound[tx]
  //
  //                    reduced_costs_violation[tx] = primal_gradient[tx] -
  //                    reduced_costs[tx]
  //                end
  //            end
  //            return
  //        end

  CUPDLP_COPY_VEC(dSlackPos, dualResidual, cupdlp_float, lp->nCols);

  cupdlp_projPos(dSlackPos, lp->nCols);

  cupdlp_edot(dSlackPos, problem->hasLower, lp->nCols);

  cupdlp_float temp = 0.0;
  // cupdlp_dot(work, lp->nCols, x, dSlackPos, &temp);
  // *dComplementarity += temp;
  // cupdlp_dot(work, lp->nCols, dSlackPos, resobj->dLowerFiltered, &temp);
  // *dComplementarity -= temp;
  cupdlp_dot(work, lp->nCols, dSlackPos, resobj->dLowerFiltered, &temp);
  *dDualObj += temp;

  CUPDLP_COPY_VEC(dSlackNeg, dualResidual, cupdlp_float, lp->nCols);

  cupdlp_projNeg(dSlackNeg, lp->nCols);

  cupdlp_scaleVector(work, -1.0, dSlackNeg, lp->nCols);

  cupdlp_edot(dSlackNeg, problem->hasUpper, lp->nCols);

  // cupdlp_dot(work, lp->nCols, x, dSlackNeg, &temp);
  // *dComplementarity -= temp;
  // cupdlp_dot(work, lp->nCols, dSlackNeg, resobj->dUpperFiltered, &temp);
  // *dComplementarity += temp;
  cupdlp_dot(work, lp->nCols, dSlackNeg, resobj->dUpperFiltered, &temp);
  *dDualObj -= temp;

  *dDualObj = *dDualObj * problem->sense_origin + problem->offset;

  alpha = -1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackPos, dualResidual);
  alpha = 1.0;
  cupdlp_axpy(work, lp->nCols, &alpha, dSlackNeg, dualResidual);

  if (scaling->ifScaled) {
    // cupdlp_edot(dualResidual, scaling->colScale, lp->nCols);
    // cupdlp_edot(dualResidual, scaling->colScale_gpu, lp->nCols);

    // cupdlp_copy_vec(work->buffer3, scaling->colScale, cupdlp_float,
    // lp->nCols); cupdlp_edot(dualResidual, work->buffer3, lp->nCols);

    cupdlp_edot(dualResidual, work->colScale, lp->nCols);
  }

  if (work->settings->iInfNormAbsLocalTermination) {
    cupdlp_int index;
    cupdlp_infNormIndex(work, lp->nCols, dualResidual, &index);
    *dDualFeasibility = fabs(dualResidual[index]);

// WIP only allow native for the moment
// #ifdef CUPDLP_CPU
//     *dDualFeasibility = fabs(dualResidual[index]);
// #else
//     double res_value = get_fabs_value(dualResidual, index, lp->nCols);
//     *dDualFeasibility = fabs(res_value);   
// #endif

  } else {
    cupdlp_twoNorm(work, lp->nCols, dualResidual, dDualFeasibility);
  }

#endif
}